

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch * absl::lts_20250127::Dequeue(PerThreadSynch *head,PerThreadSynch *pw)

{
  PerThreadSynch *pPVar1;
  bool bVar2;
  PerThreadSynch *local_28;
  PerThreadSynch *w;
  PerThreadSynch *pw_local;
  PerThreadSynch *head_local;
  
  pPVar1 = pw->next;
  pw->next = pPVar1->next;
  if (head == pPVar1) {
    local_28 = pw;
    if (pw == pPVar1) {
      local_28 = (PerThreadSynch *)0x0;
    }
    pw_local = local_28;
  }
  else {
    pw_local = head;
    if ((pw != head) && (bVar2 = MuEquivalentWaiter(pw,pw->next), bVar2)) {
      if (pw->next->skip == (PerThreadSynch *)0x0) {
        pw->skip = pw->next;
      }
      else {
        pw->skip = pw->next->skip;
      }
    }
  }
  return pw_local;
}

Assistant:

static PerThreadSynch* Dequeue(PerThreadSynch* head, PerThreadSynch* pw) {
  PerThreadSynch* w = pw->next;
  pw->next = w->next;                 // snip w out of list
  if (head == w) {                    // we removed the head
    head = (pw == w) ? nullptr : pw;  // either emptied list, or pw is new head
  } else if (pw != head && MuEquivalentWaiter(pw, pw->next)) {
    // pw can skip to its new successor
    if (pw->next->skip !=
        nullptr) {  // either skip to its successors skip target
      pw->skip = pw->next->skip;
    } else {  // or to pw's successor
      pw->skip = pw->next;
    }
  }
  return head;
}